

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::update_peer_dscp(session_impl *this)

{
  ushort uVar1;
  uint v;
  pointer psVar2;
  element_type *peVar3;
  undefined1 auVar4 [8];
  undefined2 uVar5;
  pointer psVar6;
  error_code ec;
  error_code ec_1;
  undefined1 local_e0 [8];
  bool local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  error_code local_c0;
  long local_b0 [2];
  address local_a0;
  error_code local_80;
  data_union local_6c;
  undefined1 local_50 [32];
  
  local_e0 = (undefined1  [8])&(this->m_settings).m_mutex;
  local_d8 = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e0);
  local_d8 = true;
  v = (this->m_settings).m_store.m_ints._M_elems[0x28];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e0);
  psVar2 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->m_listen_sockets).
                super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    if ((((psVar6->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->sock).
        super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      local_80.val_ = 0;
      local_80.failed_ = false;
      local_80.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      set_traffic_class<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                ((((psVar6->
                   super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->sock).
                 super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,v,&local_80);
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::local_endpoint((endpoint_type *)&local_6c.base,
                         (((psVar6->
                           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->sock).
                         super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
        if (local_6c.base.sa_family == 2) {
          local_a0._0_8_ = (ulong)local_6c.v6.sin6_flowinfo << 0x20;
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_a0.ipv6_address_.scope_id_ = 0;
        }
        else {
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_6c.base.sa_data[6];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_6c.base.sa_data[7];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_6c.base.sa_data[8];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_6c.base.sa_data[9];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_6c.base.sa_data[10];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_6c.base.sa_data[0xb];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_6c.base.sa_data[0xc];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_6c.base.sa_data[0xd];
          local_a0.ipv6_address_.addr_.__in6_u._8_8_ = local_6c._16_8_;
          local_a0.ipv6_address_.scope_id_ = (unsigned_long)local_6c.v6.sin6_scope_id;
          local_a0.type_ = ipv6;
          local_a0.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
        }
        boost::asio::ip::address::to_string_abi_cxx11_((string *)local_e0,&local_a0);
        auVar4 = local_e0;
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::local_endpoint((endpoint_type *)local_50,
                         (((psVar6->
                           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->sock).
                         super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
        uVar5 = local_50._2_2_;
        (*((error_category *)&(local_80.cat_)->_vptr_error_category)->_vptr_error_category[4])
                  (&local_c0,local_80.cat_,(ulong)(uint)local_80.val_);
        session_log(this,">>> SET_DSCP [ tcp (%s %d) value: %x e: %s ]",auVar4,
                    (ulong)(ushort)(uVar5 << 8 | (ushort)uVar5 >> 8),(ulong)v,
                    CONCAT44(local_c0._4_4_,local_c0.val_));
        if ((long *)CONCAT44(local_c0._4_4_,local_c0.val_) != local_b0) {
          operator_delete((long *)CONCAT44(local_c0._4_4_,local_c0.val_),local_b0[0] + 1);
        }
        if (local_e0 != (undefined1  [8])&local_d0) {
          operator_delete((void *)local_e0,local_d0._M_allocated_capacity + 1);
        }
      }
    }
    if ((((psVar6->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      local_50._0_4_ = 0;
      local_50[4] = '\0';
      local_50._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
      set_traffic_class<libtorrent::aux::udp_socket>
                (&((((psVar6->
                     super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->udp_sock).
                   super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->sock,v,(error_code *)local_50);
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
        peVar3 = (((psVar6->
                   super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->udp_sock).
                 super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_c0.val_ = 0;
        local_c0._4_4_ = local_c0._4_4_ & 0xffffff00;
        local_c0.cat_ =
             &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
        ;
        boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>::local_endpoint
                  ((endpoint_type *)&local_6c.base,
                   *(reactive_socket_service<boost::asio::ip::udp> **)
                    &(peVar3->sock).m_socket.
                     super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   ,&(peVar3->sock).m_socket.
                     super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     .
                     super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     .impl_.implementation_,&local_c0);
        if (local_6c.base.sa_family == 2) {
          local_a0._0_8_ = (ulong)local_6c.v6.sin6_flowinfo << 0x20;
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
          local_a0.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_a0.ipv6_address_.scope_id_ = 0;
        }
        else {
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_6c.base.sa_data[6];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_6c.base.sa_data[7];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_6c.base.sa_data[8];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_6c.base.sa_data[9];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_6c.base.sa_data[10];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_6c.base.sa_data[0xb];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_6c.base.sa_data[0xc];
          local_a0.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_6c.base.sa_data[0xd];
          local_a0.ipv6_address_.addr_.__in6_u._8_8_ = local_6c._16_8_;
          local_a0.ipv6_address_.scope_id_ = (unsigned_long)local_6c.v6.sin6_scope_id;
          local_a0.type_ = ipv6;
          local_a0.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
        }
        boost::asio::ip::address::to_string_abi_cxx11_((string *)local_e0,&local_a0);
        auVar4 = local_e0;
        uVar1 = (((((psVar6->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->udp_sock).
                  super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->sock).m_bind_port;
        (**(code **)(*(long *)local_50._8_8_ + 0x20))(&local_c0,local_50._8_8_,local_50._0_4_);
        session_log(this,">>> SET_DSCP [ udp (%s %d) value: %x e: %s ]",auVar4,(ulong)uVar1,(ulong)v
                    ,CONCAT44(local_c0._4_4_,local_c0.val_));
        if ((long *)CONCAT44(local_c0._4_4_,local_c0.val_) != local_b0) {
          operator_delete((long *)CONCAT44(local_c0._4_4_,local_c0.val_),local_b0[0] + 1);
        }
        if (local_e0 != (undefined1  [8])&local_d0) {
          operator_delete((void *)local_e0,local_d0._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void session_impl::update_peer_dscp()
	{
		int const value = m_settings.get_int(settings_pack::peer_dscp);
		for (auto const& l : m_listen_sockets)
		{
			if (l->sock)
			{
				error_code ec;
				set_traffic_class(*l->sock, value, ec);

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log(">>> SET_DSCP [ tcp (%s %d) value: %x e: %s ]"
						, l->sock->local_endpoint().address().to_string().c_str()
						, l->sock->local_endpoint().port(), value, ec.message().c_str());
				}
#endif
			}

			if (l->udp_sock)
			{
				error_code ec;
				set_traffic_class(l->udp_sock->sock, value, ec);

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					session_log(">>> SET_DSCP [ udp (%s %d) value: %x e: %s ]"
						, l->udp_sock->sock.local_endpoint().address().to_string().c_str()
						, l->udp_sock->sock.local_port()
						, value, ec.message().c_str());
				}
#endif
			}
		}
	}